

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::ByteSizeLong
          (UniDirectionalLSTMLayerParams *this)

{
  LSTMParams *pLVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Type *this_00;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint index;
  size_t sVar9;
  
  uVar4 = (this->activations_).super_RepeatedPtrFieldBase.current_size_;
  sVar9 = (size_t)uVar4;
  if (sVar9 == 0) {
    sVar9 = 0;
  }
  else {
    index = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                          (&(this->activations_).super_RepeatedPtrFieldBase,index);
      sVar5 = ActivationParams::ByteSizeLong(this_00);
      uVar3 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar9 = sVar9 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  pLVar1 = this->params_;
  if (this != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_ &&
      pLVar1 != (LSTMParams *)0x0) {
    lVar7 = 0;
    if (pLVar1->cellclipthreshold_ != 0.0) {
      lVar7 = 6;
    }
    if (NAN(pLVar1->cellclipthreshold_)) {
      lVar7 = 6;
    }
    lVar8 = lVar7 + 2;
    if (pLVar1->sequenceoutput_ == false) {
      lVar8 = lVar7;
    }
    lVar7 = lVar8 + 3;
    if (pLVar1->hasbiasvectors_ == false) {
      lVar7 = lVar8;
    }
    lVar8 = lVar7 + 3;
    if (pLVar1->forgetbias_ == false) {
      lVar8 = lVar7;
    }
    lVar7 = lVar8 + 3;
    if (pLVar1->haspeepholevectors_ == false) {
      lVar7 = lVar8;
    }
    lVar8 = lVar7 + 3;
    if (pLVar1->coupledinputandforgetgate_ == false) {
      lVar8 = lVar7;
    }
    pLVar1->_cached_size_ = (int)lVar8;
    sVar9 = sVar9 + lVar8 + 2;
  }
  if (this->weightparams_ != (LSTMWeightParams *)0x0 &&
      this != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_) {
    sVar5 = LSTMWeightParams::ByteSizeLong(this->weightparams_);
    uVar4 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar9 = sVar9 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  if (this->inputvectorsize_ != 0) {
    uVar6 = this->inputvectorsize_ | 1;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar9 = sVar9 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  if (this->outputvectorsize_ != 0) {
    uVar6 = this->outputvectorsize_ | 1;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar9 = sVar9 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = sVar9 + 3;
  if (this->reverseinput_ == false) {
    sVar5 = sVar9;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t UniDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  {
    unsigned int count = this->activations_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activations(i));
    }
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->params_);
  }

  // .CoreML.Specification.LSTMWeightParams weightParams = 20;
  if (this->has_weightparams()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weightparams_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}